

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O0

XXH64_hash_t
XXH3_len_129to240_64b(xxh_u8 *input,size_t len,xxh_u8 *secret,size_t secretSize,XXH64_hash_t seed)

{
  ulong uVar1;
  int iVar2;
  XXH64_hash_t XVar3;
  ulong in_RSI;
  xxh_u8 *in_RDI;
  int i;
  int nbRounds;
  xxh_u64 acc;
  undefined4 local_38;
  
  iVar2 = (int)in_RSI;
  uVar1 = in_RSI & 0xffffffff;
  for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
    XXH3_mix16B(_i,in_RDI,in_RSI);
  }
  XXH3_avalanche(0x109749);
  for (local_38 = 8; local_38 < (int)((long)((ulong)(uint)(iVar2 >> 0x1f) << 0x20 | uVar1) / 0x10);
      local_38 = local_38 + 1) {
    XXH3_mix16B(_i,in_RDI,in_RSI);
  }
  XXH3_mix16B(_i,in_RDI,in_RSI);
  XVar3 = XXH3_avalanche(0x1097e0);
  return XVar3;
}

Assistant:

XXH_NO_INLINE XXH64_hash_t
XXH3_len_129to240_64b(const xxh_u8* XXH_RESTRICT input, size_t len,
                      const xxh_u8* XXH_RESTRICT secret, size_t secretSize,
                      XXH64_hash_t seed)
{
    XXH_ASSERT(secretSize >= XXH3_SECRET_SIZE_MIN); (void)secretSize;
    XXH_ASSERT(128 < len && len <= XXH3_MIDSIZE_MAX);

    #define XXH3_MIDSIZE_STARTOFFSET 3
    #define XXH3_MIDSIZE_LASTOFFSET  17

    {   xxh_u64 acc = len * PRIME64_1;
        int const nbRounds = (int)len / 16;
        int i;
        for (i=0; i<8; i++) {
            acc += XXH3_mix16B(input+(16*i), secret+(16*i), seed);
        }
        acc = XXH3_avalanche(acc);
        XXH_ASSERT(nbRounds >= 8);
#if defined(__clang__)                                /* Clang */ \
    && (defined(__ARM_NEON) || defined(__ARM_NEON__)) /* NEON */ \
    && !defined(XXH_ENABLE_AUTOVECTORIZE)             /* Define to disable */
        /*
         * UGLY HACK:
         * Clang for ARMv7-A tries to vectorize this loop, similar to GCC x86.
         * In everywhere else, it uses scalar code.
         *
         * For 64->128-bit multiplies, even if the NEON was 100% optimal, it
         * would still be slower than UMAAL (see XXH_mult64to128).
         *
         * Unfortunately, Clang doesn't handle the long multiplies properly and
         * converts them to the nonexistent "vmulq_u64" intrinsic, which is then
         * scalarized into an ugly mess of VMOV.32 instructions.
         *
         * This mess is difficult to avoid without turning autovectorization
         * off completely, but they are usually relatively minor and/or not
         * worth it to fix.
         *
         * This loop is the easiest to fix, as unlike XXH32, this pragma
         * _actually works_ because it is a loop vectorization instead of an
         * SLP vectorization.
         */
        #pragma clang loop vectorize(disable)
#endif
        for (i=8 ; i < nbRounds; i++) {
            acc += XXH3_mix16B(input+(16*i), secret+(16*(i-8)) + XXH3_MIDSIZE_STARTOFFSET, seed);
        }
        /* last bytes */
        acc += XXH3_mix16B(input + len - 16, secret + XXH3_SECRET_SIZE_MIN - XXH3_MIDSIZE_LASTOFFSET, seed);
        return XXH3_avalanche(acc);
    }
}